

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O0

void __thiscall
Function_Pool::AreaInfo::_copy
          (AreaInfo *this,AreaInfo *info,uint32_t x,uint32_t y,uint32_t width_,uint32_t height_)

{
  value_type vVar1;
  size_t sVar2;
  const_reference pvVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  bool in_stack_0000001b;
  uint32_t in_stack_0000001c;
  uint32_t in_stack_00000020;
  uint32_t in_stack_00000024;
  uint32_t in_stack_00000028;
  uint32_t in_stack_0000002c;
  AreaInfo *in_stack_00000030;
  size_t i;
  bool yAxis;
  ulong local_30;
  
  sVar2 = _size((AreaInfo *)0x12d504);
  if (sVar2 != 0) {
    for (local_30 = 0; sVar2 = _size((AreaInfo *)0x12d530), local_30 < sVar2 - 1;
        local_30 = local_30 + 1) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RSI,local_30)
      ;
      vVar1 = *pvVar3;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RSI,local_30 + 1);
      if (vVar1 != *pvVar3) break;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RSI + 2,local_30);
      vVar1 = *pvVar3;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RSI + 2,local_30 + 1);
      if (vVar1 != *pvVar3) break;
    }
    _size((AreaInfo *)0x12d5f9);
    _fill(in_stack_00000030,in_stack_0000002c,in_stack_00000028,in_stack_00000024,in_stack_00000020,
          in_stack_0000001c,in_stack_0000001b);
  }
  return;
}

Assistant:

void AreaInfo::_copy( const AreaInfo & info, uint32_t x, uint32_t y, uint32_t width_, uint32_t height_ )
    {
        if( info._size() > 0 ) {
            bool yAxis = true;

            for( size_t i = 0; i < info._size() - 1; ++i ) {
                if( info.startX[i] != info.startX[i + 1] || info.width[i] != info.width[i + 1] ) {
                    yAxis = false;
                    break;
                }
            }

            _fill( x, y, width_, height_, static_cast<uint32_t>(info._size()), yAxis );
        }
    }